

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>::
emplace_back<slang::ast::Expression_const&,slang::ast::ValueSymbol_const&>
          (SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState> *this,Expression *args,
          ValueSymbol *args_1)

{
  size_type sVar1;
  pointer pPVar2;
  Type *pTVar3;
  
  pPVar2 = this->data_ + this->len;
  if (this->len == this->cap) {
    pPVar2 = emplaceRealloc<slang::ast::Expression_const&,slang::ast::ValueSymbol_const&>
                       (this,pPVar2,args,args_1);
    return pPVar2;
  }
  (pPVar2->longestStaticPrefix).ptr = args;
  (pPVar2->symbol).ptr = args_1;
  pTVar3 = ast::DeclaredType::getType(&args_1->declaredType);
  (pPVar2->rootType).ptr = pTVar3;
  (pPVar2->intervals).height = 0;
  (pPVar2->intervals).rootSize = 0;
  sVar1 = this->len;
  this->len = sVar1 + 1;
  return this->data_ + sVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }